

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.h
# Opt level: O2

size_t GetDataSize<RevocationEntry>(vector<RevocationEntry,_std::allocator<RevocationEntry>_> *in)

{
  pointer pRVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar4 = 0;
  uVar2 = 0;
  while( true ) {
    pRVar1 = (in->super__Vector_base<RevocationEntry,_std::allocator<RevocationEntry>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(in->super__Vector_base<RevocationEntry,_std::allocator<RevocationEntry>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x98) <=
        (ulong)uVar2) break;
    sVar3 = DerBase::EncodedSize(&pRVar1[uVar2].super_DerBase);
    sVar4 = sVar4 + sVar3;
    uVar2 = uVar2 + 1;
  }
  return sVar4;
}

Assistant:

size_t GetDataSize(std::vector<T>& in) 
{
	size_t ret = 0;
	for (unsigned int i = 0; i < in.size(); ++i)
	{
		ret += in[i].EncodedSize();
	}

	return ret;
}